

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SpvBuilder.cpp
# Opt level: O0

Id __thiscall spv::Builder::findCompositeConstant(Builder *this,Op typeClass,Vector<Id> *comps)

{
  bool bVar1;
  bool bVar2;
  Id IVar3;
  int iVar4;
  size_type sVar5;
  const_reference ppIVar6;
  const_reference pvVar7;
  Id local_68;
  int local_3c;
  int op;
  int iStack_30;
  bool mismatch;
  int i_1;
  int i;
  bool found;
  Instruction *constant;
  Vector<Id> *comps_local;
  Op typeClass_local;
  Builder *this_local;
  
  _i = (Instruction *)0x0;
  bVar2 = false;
  if (typeClass == OpTypeCooperativeMatrixKHR) {
    iStack_30 = 0;
    while( true ) {
      sVar5 = std::vector<spv::Instruction_*,_dxil_spv::ThreadLocalAllocator<spv::Instruction_*>_>::
              size(&this->coopmatConstants);
      bVar1 = false;
      if (iStack_30 < (int)sVar5) {
        bVar1 = (bool)(bVar2 ^ 1);
      }
      if (!bVar1) break;
      ppIVar6 = std::vector<spv::Instruction_*,_dxil_spv::ThreadLocalAllocator<spv::Instruction_*>_>
                ::operator[](&this->coopmatConstants,(long)iStack_30);
      _i = *ppIVar6;
      IVar3 = Instruction::getIdOperand(_i,0);
      pvVar7 = std::vector<unsigned_int,_dxil_spv::ThreadLocalAllocator<unsigned_int>_>::operator[]
                         (comps,0);
      if (IVar3 == *pvVar7) {
        bVar2 = true;
      }
      iStack_30 = iStack_30 + 1;
    }
  }
  else {
    for (op = 0; sVar5 = std::
                         vector<spv::Instruction_*,_dxil_spv::ThreadLocalAllocator<spv::Instruction_*>_>
                         ::size(this->groupedConstants + typeClass), op < (int)sVar5; op = op + 1) {
      ppIVar6 = std::vector<spv::Instruction_*,_dxil_spv::ThreadLocalAllocator<spv::Instruction_*>_>
                ::operator[](this->groupedConstants + typeClass,(long)op);
      _i = *ppIVar6;
      iVar4 = Instruction::getNumOperands(_i);
      sVar5 = std::vector<unsigned_int,_dxil_spv::ThreadLocalAllocator<unsigned_int>_>::size(comps);
      if (iVar4 == (int)sVar5) {
        bVar1 = false;
        for (local_3c = 0; iVar4 = Instruction::getNumOperands(_i), local_3c < iVar4;
            local_3c = local_3c + 1) {
          IVar3 = Instruction::getIdOperand(_i,local_3c);
          pvVar7 = std::vector<unsigned_int,_dxil_spv::ThreadLocalAllocator<unsigned_int>_>::
                   operator[](comps,(long)local_3c);
          if (IVar3 != *pvVar7) {
            bVar1 = true;
            break;
          }
        }
        if (!bVar1) {
          bVar2 = true;
          break;
        }
      }
    }
  }
  if (bVar2) {
    local_68 = Instruction::getResultId(_i);
  }
  else {
    local_68 = 0;
  }
  return local_68;
}

Assistant:

Id Builder::findCompositeConstant(Op typeClass, const dxil_spv::Vector<Id>& comps) const
{
    Instruction* constant = 0;
    bool found = false;

    if (typeClass == spv::OpTypeCooperativeMatrixKHR) {
        for (int i = 0; i < (int)coopmatConstants.size() && !found; ++i) {
            constant = coopmatConstants[i];
            if (constant->getIdOperand(0) == comps[0])
                found = true;
        }
    } else {
        for (int i = 0; i < (int) groupedConstants[typeClass].size(); ++i) {
            constant = groupedConstants[typeClass][i];

            // same shape?
            if (constant->getNumOperands() != (int) comps.size())
                continue;

            // same contents?
            bool mismatch = false;
            for (int op = 0; op < constant->getNumOperands(); ++op)
            {
                if (constant->getIdOperand(op) != comps[op])
                {
                    mismatch = true;
                    break;
                }
            }
            if (!mismatch)
            {
                found = true;
                break;
            }
        }
    }

    return found ? constant->getResultId() : NoResult;
}